

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::variable_storage_requires_stage_io(CompilerMSL *this,StorageClass storage)

{
  bool bVar1;
  byte bVar2;
  
  if (storage == StorageClassInput) {
    bVar1 = is_tesc_shader(this);
    if ((bVar1) && ((this->msl_options).multi_patch_workgroup != false)) {
      return false;
    }
    bVar1 = is_tese_shader(this);
    bVar2 = bVar1 & (this->msl_options).raw_buffer_tese_input;
  }
  else {
    if (storage != StorageClassOutput) {
      return false;
    }
    bVar2 = this->capture_output_to_buffer;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool CompilerMSL::variable_storage_requires_stage_io(spv::StorageClass storage) const
{
	if (storage == StorageClassOutput)
		return !capture_output_to_buffer;
	else if (storage == StorageClassInput)
		return !(is_tesc_shader() && msl_options.multi_patch_workgroup) &&
		       !(is_tese_shader() && msl_options.raw_buffer_tese_input);
	else
		return false;
}